

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
FormatterTest_RuntimePrecision_Test::TestBody(FormatterTest_RuntimePrecision_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_33;
  format_error *e_30;
  bool gtest_caught_expected_30;
  string gtest_expected_message_30;
  AssertionResult gtest_ar_32;
  format_error *e_29;
  bool gtest_caught_expected_29;
  string gtest_expected_message_29;
  AssertionResult gtest_ar_31;
  AssertionResult gtest_ar_30;
  AssertionResult gtest_ar_29;
  format_error *e_28;
  bool gtest_caught_expected_28;
  string gtest_expected_message_28;
  AssertionResult gtest_ar_28;
  format_error *e_27;
  bool gtest_caught_expected_27;
  string gtest_expected_message_27;
  AssertionResult gtest_ar_27;
  format_error *e_26;
  bool gtest_caught_expected_26;
  string gtest_expected_message_26;
  AssertionResult gtest_ar_26;
  format_error *e_25;
  bool gtest_caught_expected_25;
  string gtest_expected_message_25;
  AssertionResult gtest_ar_25;
  format_error *e_24;
  bool gtest_caught_expected_24;
  string gtest_expected_message_24;
  AssertionResult gtest_ar_24;
  format_error *e_23;
  bool gtest_caught_expected_23;
  string gtest_expected_message_23;
  AssertionResult gtest_ar_23;
  format_error *e_22;
  bool gtest_caught_expected_22;
  string gtest_expected_message_22;
  AssertionResult gtest_ar_22;
  format_error *e_21;
  bool gtest_caught_expected_21;
  string gtest_expected_message_21;
  AssertionResult gtest_ar_21;
  format_error *e_20;
  bool gtest_caught_expected_20;
  string gtest_expected_message_20;
  AssertionResult gtest_ar_20;
  format_error *e_19;
  bool gtest_caught_expected_19;
  string gtest_expected_message_19;
  AssertionResult gtest_ar_19;
  format_error *e_18;
  bool gtest_caught_expected_18;
  string gtest_expected_message_18;
  AssertionResult gtest_ar_18;
  format_error *e_17;
  bool gtest_caught_expected_17;
  string gtest_expected_message_17;
  AssertionResult gtest_ar_17;
  format_error *e_16;
  bool gtest_caught_expected_16;
  string gtest_expected_message_16;
  AssertionResult gtest_ar_16;
  format_error *e_15;
  bool gtest_caught_expected_15;
  string gtest_expected_message_15;
  AssertionResult gtest_ar_15;
  format_error *e_14;
  bool gtest_caught_expected_14;
  string gtest_expected_message_14;
  AssertionResult gtest_ar_14;
  format_error *e_13;
  bool gtest_caught_expected_13;
  string gtest_expected_message_13;
  AssertionResult gtest_ar_13;
  format_error *e_12;
  bool gtest_caught_expected_12;
  string gtest_expected_message_12;
  AssertionResult gtest_ar_12;
  long value;
  format_error *e_11;
  bool gtest_caught_expected_11;
  string gtest_expected_message_11;
  AssertionResult gtest_ar_11;
  format_error *e_10;
  bool gtest_caught_expected_10;
  string gtest_expected_message_10;
  AssertionResult gtest_ar_10;
  format_error *e_9;
  bool gtest_caught_expected_9;
  string gtest_expected_message_9;
  AssertionResult gtest_ar_9;
  format_error *e_8;
  bool gtest_caught_expected_8;
  string gtest_expected_message_8;
  AssertionResult gtest_ar_8;
  format_error *e_7;
  bool gtest_caught_expected_7;
  string gtest_expected_message_7;
  AssertionResult gtest_ar_7;
  format_error *e_6;
  bool gtest_caught_expected_6;
  string gtest_expected_message_6;
  AssertionResult gtest_ar_6;
  format_error *e_5;
  bool gtest_caught_expected_5;
  string gtest_expected_message_5;
  AssertionResult gtest_ar_5;
  format_error *e_4;
  bool gtest_caught_expected_4;
  string gtest_expected_message_4;
  AssertionResult gtest_ar_4;
  format_error *e_3;
  bool gtest_caught_expected_3;
  string gtest_expected_message_3;
  AssertionResult gtest_ar_3;
  format_error *e_2;
  bool gtest_caught_expected_2;
  string gtest_expected_message_2;
  AssertionResult gtest_ar_2;
  format_error *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_1;
  size_t size;
  format_error *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  char format_str [256];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe3f0;
  undefined7 in_stack_ffffffffffffe3f8;
  undefined1 in_stack_ffffffffffffe3ff;
  char *in_stack_ffffffffffffe400;
  string *actual_expression;
  char *in_stack_ffffffffffffe408;
  int line;
  char *in_stack_ffffffffffffe410;
  undefined4 in_stack_ffffffffffffe418;
  Type in_stack_ffffffffffffe41c;
  AssertionResult *in_stack_ffffffffffffe420;
  char (*in_stack_ffffffffffffe428) [256];
  undefined7 in_stack_ffffffffffffe438;
  undefined1 in_stack_ffffffffffffe43f;
  allocator *in_stack_ffffffffffffe440;
  char (*in_stack_ffffffffffffe448) [10];
  AssertionResult *this_01;
  Message *in_stack_ffffffffffffe468;
  AssertHelper *in_stack_ffffffffffffe470;
  string local_11f8 [32];
  AssertionResult local_11d8 [3];
  undefined4 local_11a4;
  undefined8 local_11a0;
  string local_1198 [38];
  byte local_1172;
  allocator local_1171;
  string local_1170 [32];
  AssertionResult local_1150 [3];
  undefined4 local_111c;
  undefined8 local_1118;
  string local_1110 [38];
  byte local_10ea;
  allocator local_10e9;
  string local_10e8 [32];
  AssertionResult local_10c8 [2];
  unkbyte10 local_10a8;
  undefined4 local_108c;
  string local_1088 [32];
  AssertionResult local_1068 [2];
  undefined4 local_1044;
  undefined8 local_1040;
  string local_1038 [32];
  AssertionResult local_1018 [3];
  undefined4 local_fe8;
  undefined1 local_fe1;
  string local_fe0 [38];
  byte local_fba;
  allocator local_fb9;
  string local_fb8 [32];
  AssertionResult local_f98 [3];
  undefined4 local_f64;
  undefined8 local_f60;
  string local_f58 [38];
  byte local_f32;
  allocator local_f31;
  string local_f30 [32];
  AssertionResult local_f10 [3];
  undefined4 local_edc;
  undefined8 local_ed8;
  string local_ed0 [38];
  byte local_eaa;
  allocator local_ea9;
  string local_ea8 [32];
  AssertionResult local_e88 [3];
  undefined4 local_e54;
  undefined8 local_e50;
  string local_e48 [38];
  byte local_e22;
  allocator local_e21;
  string local_e20 [32];
  AssertionResult local_e00 [3];
  undefined4 local_dcc;
  undefined8 local_dc8;
  string local_dc0 [38];
  byte local_d9a;
  allocator local_d99;
  string local_d98 [32];
  AssertionResult local_d78 [3];
  undefined4 local_d44;
  undefined8 local_d40;
  string local_d38 [38];
  byte local_d12;
  allocator local_d11;
  string local_d10 [32];
  AssertionResult local_cf0 [3];
  undefined4 local_cbc;
  undefined8 local_cb8;
  string local_cb0 [38];
  byte local_c8a;
  allocator local_c89;
  string local_c88 [32];
  AssertionResult local_c68 [3];
  undefined4 local_c34;
  undefined8 local_c30;
  string local_c28 [38];
  byte local_c02;
  allocator local_c01;
  string local_c00 [32];
  AssertionResult local_be0 [3];
  undefined4 local_bac;
  undefined8 local_ba8;
  string local_ba0 [38];
  byte local_b7a;
  allocator local_b79;
  string local_b78 [32];
  AssertionResult local_b58 [3];
  undefined4 local_b28;
  undefined4 local_b24;
  string local_b20 [38];
  byte local_afa;
  allocator local_af9;
  string local_af8 [32];
  AssertionResult local_ad8 [3];
  undefined4 local_aa8;
  undefined4 local_aa4;
  string local_aa0 [38];
  byte local_a7a;
  allocator local_a79;
  string local_a78 [32];
  AssertionResult local_a58 [3];
  undefined4 local_a28;
  undefined4 local_a24;
  string local_a20 [38];
  byte local_9fa;
  allocator local_9f9;
  string local_9f8 [32];
  AssertionResult local_9d8 [3];
  undefined4 local_9a8;
  undefined4 local_9a4;
  string local_9a0 [38];
  byte local_97a;
  allocator local_979;
  string local_978 [32];
  AssertionResult local_958 [3];
  undefined8 local_928;
  undefined4 local_91c;
  string local_918 [38];
  byte local_8f2;
  allocator local_8f1;
  string local_8f0 [32];
  AssertionResult local_8d0 [3];
  undefined1 local_89d;
  undefined4 local_89c;
  string local_898 [38];
  byte local_872;
  allocator local_871;
  string local_870 [32];
  AssertionResult local_850 [3];
  undefined8 local_820;
  undefined4 local_814;
  string local_810 [38];
  byte local_7ea;
  allocator local_7e9;
  string local_7e8 [32];
  AssertionResult local_7c8 [3];
  long local_798;
  undefined4 local_78c;
  string local_788 [38];
  byte local_762;
  allocator local_761;
  string local_760 [32];
  AssertionResult local_740;
  long local_730;
  undefined8 local_708;
  undefined4 local_6fc;
  string local_6f8 [38];
  byte local_6d2;
  allocator local_6d1;
  string local_6d0 [32];
  AssertionResult local_6b0 [3];
  undefined4 local_680;
  undefined4 local_67c;
  string local_678 [38];
  byte local_652;
  allocator local_651;
  string local_650 [32];
  AssertionResult local_630 [3];
  undefined4 local_600;
  undefined4 local_5fc;
  string local_5f8 [38];
  byte local_5d2;
  allocator local_5d1;
  string local_5d0 [32];
  AssertionResult local_5b0 [3];
  undefined4 local_57c;
  string local_578 [38];
  byte local_552;
  allocator local_551;
  string local_550 [32];
  AssertionResult local_530 [3];
  undefined4 local_4fc;
  string local_4f8 [38];
  byte local_4d2;
  allocator local_4d1;
  string local_4d0 [32];
  AssertionResult local_4b0 [3];
  undefined4 local_480;
  undefined4 local_47c;
  string local_478 [38];
  byte local_452;
  allocator local_451;
  string local_450 [32];
  AssertionResult local_430 [3];
  undefined4 local_3fc;
  string local_3f8 [38];
  byte local_3d2;
  allocator local_3d1;
  string local_3d0 [32];
  AssertionResult local_3b0 [3];
  undefined4 local_37c;
  string local_378 [38];
  byte local_352;
  allocator local_351;
  string local_350 [32];
  AssertionResult local_330 [3];
  undefined4 local_2fc;
  string local_2f8 [38];
  byte local_2d2;
  allocator local_2d1;
  string local_2d0 [32];
  AssertionResult local_2b0 [3];
  undefined4 local_27c;
  string local_278 [38];
  byte local_252;
  allocator local_251;
  string local_250 [32];
  AssertionResult local_230 [3];
  undefined4 local_1fc;
  string local_1f8 [38];
  byte local_1d2;
  allocator local_1d1;
  string local_1d0 [32];
  AssertionResult local_1b0;
  size_t local_1a0;
  int local_178;
  undefined4 local_174;
  string local_170 [38];
  byte local_14a;
  allocator local_149;
  string local_148 [48];
  AssertionResult local_118;
  char local_108 [264];
  
  safe_sprintf<256ul>((char (*) [256])local_108,"{0:.{%u",0xffffffff);
  increment((char *)in_stack_ffffffffffffe3f0);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"number is too big",&local_149);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    local_14a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_174 = 0;
      fmt::v5::format<char[256],int>(in_stack_ffffffffffffe428,(int *)in_stack_ffffffffffffe420);
      std::__cxx11::string::~string(local_170);
    }
    if ((local_14a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [103])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 2;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_148);
    if (local_178 != 0) goto LAB_0015ca4c;
  }
  else {
LAB_0015ca4c:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x15ca68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x15cacb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15cb23);
  local_1a0 = strlen(local_108);
  local_108[local_1a0] = '}';
  local_108[local_1a0 + 1] = '\0';
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"number is too big",&local_1d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    local_1d2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_1fc = 0;
      fmt::v5::format<char[256],int>(in_stack_ffffffffffffe428,(int *)in_stack_ffffffffffffe420);
      std::__cxx11::string::~string(local_1f8);
    }
    if ((local_1d2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [103])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 3;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_1d0);
    if (local_178 != 0) goto LAB_0015cf0c;
  }
  else {
LAB_0015cf0c:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x15cf28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x15cf8b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15cfe3);
  local_108[local_1a0 + 1] = '}';
  local_108[local_1a0 + 2] = '\0';
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_230);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_250,"number is too big",&local_251);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    local_252 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_27c = 0;
      fmt::v5::format<char[256],int>(in_stack_ffffffffffffe428,(int *)in_stack_ffffffffffffe420);
      std::__cxx11::string::~string(local_278);
    }
    if ((local_252 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [103])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 4;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_250);
    if (local_178 != 0) goto LAB_0015d3ac;
  }
  else {
LAB_0015d3ac:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x15d3c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x15d42b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15d483);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d0,"invalid format string",&local_2d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
    local_2d2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_2fc = 0;
      fmt::v5::format<char[6],int>
                ((char (*) [6])in_stack_ffffffffffffe428,(int *)in_stack_ffffffffffffe420);
      std::__cxx11::string::~string(local_2f8);
    }
    if ((local_2d2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [100])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 5;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_2d0);
    if (local_178 != 0) goto LAB_0015d829;
  }
  else {
LAB_0015d829:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x15d845);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x15d8a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15d900);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_330);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_350,"cannot switch from manual to automatic argument indexing",&local_351);
    std::allocator<char>::~allocator((allocator<char> *)&local_351);
    local_352 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_37c = 0;
      fmt::v5::format<char[7],int>
                ((char (*) [7])in_stack_ffffffffffffe428,(int *)in_stack_ffffffffffffe420);
      std::__cxx11::string::~string(local_378);
    }
    if ((local_352 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [101])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 6;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_350);
    if (local_178 != 0) goto LAB_0015dca6;
  }
  else {
LAB_0015dca6:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x15dcc2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x15dd25);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15dd7d);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3b0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3d0,"invalid format string",&local_3d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
    local_3d2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_3fc = 0;
      fmt::v5::format<char[9],int>
                ((char (*) [9])in_stack_ffffffffffffe428,(int *)in_stack_ffffffffffffe420);
      std::__cxx11::string::~string(local_3f8);
    }
    if ((local_3d2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [103])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 7;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_3d0);
    if (local_178 != 0) goto LAB_0015e123;
  }
  else {
LAB_0015e123:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x15e13f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x15e1a2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15e1fa);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_430);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_450,"precision not allowed for this argument type",&local_451);
    std::allocator<char>::~allocator((allocator<char> *)&local_451);
    local_452 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_47c = 0;
      local_480 = 0;
      fmt::v5::format<char[8],int,int>
                ((char (*) [8])in_stack_ffffffffffffe448,(int *)in_stack_ffffffffffffe440,
                 (int *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_478);
    }
    if ((local_452 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [105])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 8;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_450);
    if (local_178 != 0) goto LAB_0015e5b3;
  }
  else {
LAB_0015e5b3:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x15e5cf);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x15e632);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15e68a);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4b0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4d0,"argument index out of range",&local_4d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
    local_4d2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_4fc = 0;
      fmt::v5::format<char[9],int>
                ((char (*) [9])in_stack_ffffffffffffe428,(int *)in_stack_ffffffffffffe420);
      std::__cxx11::string::~string(local_4f8);
    }
    if ((local_4d2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [103])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 9;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_4d0);
    if (local_178 != 0) goto LAB_0015ea30;
  }
  else {
LAB_0015ea30:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x15ea4c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x15eaaf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15eb07);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_530);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_550,"invalid format string",&local_551);
    std::allocator<char>::~allocator((allocator<char> *)&local_551);
    local_552 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_57c = 0;
      fmt::v5::format<char[10],int>
                ((char (*) [10])in_stack_ffffffffffffe428,(int *)in_stack_ffffffffffffe420);
      std::__cxx11::string::~string(local_578);
    }
    if ((local_552 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [104])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 10;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_550);
    if (local_178 != 0) goto LAB_0015eead;
  }
  else {
LAB_0015eead:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x15eec9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x15ef2c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15ef84);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5b0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5d0,"negative precision",&local_5d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
    local_5d2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_5fc = 0;
      local_600 = 0xffffffff;
      fmt::v5::format<char[9],int,int>
                ((char (*) [9])in_stack_ffffffffffffe448,(int *)in_stack_ffffffffffffe440,
                 (int *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_5f8);
    }
    if ((local_5d2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [107])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 0xb;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_5d0);
    if (local_178 != 0) goto LAB_0015f33d;
  }
  else {
LAB_0015f33d:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x15f359);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x15f3bc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15f414);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_630);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_650,"number is too big",&local_651);
    std::allocator<char>::~allocator((allocator<char> *)&local_651);
    local_652 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_67c = 0;
      local_680 = 0x80000000;
      fmt::v5::format<char[9],int,unsigned_int>
                ((char (*) [9])in_stack_ffffffffffffe448,(int *)in_stack_ffffffffffffe440,
                 (uint *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_678);
    }
    if ((local_652 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [122])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 0xc;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_650);
    if (local_178 != 0) goto LAB_0015f7cd;
  }
  else {
LAB_0015f7cd:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x15f7e9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x15f84c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15f8a4);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6b0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6d0,"negative precision",&local_6d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
    local_6d2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_6fc = 0;
      local_708 = 0xffffffffffffffff;
      fmt::v5::format<char[9],int,long>
                ((char (*) [9])in_stack_ffffffffffffe448,(int *)in_stack_ffffffffffffe440,
                 (long *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_6f8);
    }
    if ((local_6d2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [108])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 0xd;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_6d0);
    if (local_178 != 0) goto LAB_0015fc5e;
  }
  else {
LAB_0015fc5e:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x15fc7a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x15fcdd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15fd35);
  bVar1 = fmt::v5::internal::const_check<bool>(true);
  if (bVar1) {
    local_730 = 0x7fffffff;
    testing::AssertionSuccess();
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_740);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_760,"number is too big",&local_761);
      std::allocator<char>::~allocator((allocator<char> *)&local_761);
      local_762 = 0;
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        local_78c = 0;
        local_798 = local_730 + 1;
        fmt::v5::format<char[9],int,long>
                  ((char (*) [9])in_stack_ffffffffffffe448,(int *)in_stack_ffffffffffffe440,
                   (long *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
        std::__cxx11::string::~string(local_788);
      }
      if ((local_762 & 1) == 0) {
        testing::AssertionResult::operator<<
                  (in_stack_ffffffffffffe420,
                   (char (*) [116])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
        local_178 = 0xe;
      }
      else {
        local_178 = 0;
      }
      std::__cxx11::string::~string(local_760);
      if (local_178 != 0) goto LAB_00160115;
    }
    else {
LAB_00160115:
      testing::Message::Message((Message *)in_stack_ffffffffffffe420);
      testing::AssertionResult::failure_message((AssertionResult *)0x160131);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
                 in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
                 in_stack_ffffffffffffe400);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
      testing::Message::~Message((Message *)0x160194);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1601e9);
  }
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_7c8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7e8,"number is too big",&local_7e9);
    std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
    local_7ea = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_814 = 0;
      local_820 = 0x80000000;
      fmt::v5::format<char[9],int,unsigned_long>
                ((char (*) [9])in_stack_ffffffffffffe448,(int *)in_stack_ffffffffffffe440,
                 (unsigned_long *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_810);
    }
    if ((local_7ea & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [123])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 0xf;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_7e8);
    if (local_178 != 0) goto LAB_001605a6;
  }
  else {
LAB_001605a6:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x1605c2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x160625);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16067d);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_850);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_870,"precision is not integer",&local_871);
    std::allocator<char>::~allocator((allocator<char> *)&local_871);
    local_872 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_89c = 0;
      local_89d = 0x30;
      fmt::v5::format<char[9],int,char>
                ((char (*) [9])in_stack_ffffffffffffe448,(int *)in_stack_ffffffffffffe440,
                 (char *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_898);
    }
    if ((local_872 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [108])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 0x10;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_870);
    if (local_178 != 0) goto LAB_00160a33;
  }
  else {
LAB_00160a33:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x160a4f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x160ab2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x160b0a);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8d0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8f0,"precision is not integer",&local_8f1);
    std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
    local_8f2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_91c = 0;
      local_928 = 0;
      fmt::v5::format<char[9],int,double>
                ((char (*) [9])in_stack_ffffffffffffe448,(int *)in_stack_ffffffffffffe440,
                 (double *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_918);
    }
    if ((local_8f2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [108])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 0x11;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_8f0);
    if (local_178 != 0) goto LAB_00160ec4;
  }
  else {
LAB_00160ec4:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x160ee0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x160f43);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x160f9b);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_958);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_978,"precision not allowed for this argument type",&local_979);
    std::allocator<char>::~allocator((allocator<char> *)&local_979);
    local_97a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_9a4 = 0x2a;
      local_9a8 = 2;
      fmt::v5::format<char[9],int,int>
                ((char (*) [9])in_stack_ffffffffffffe448,(int *)in_stack_ffffffffffffe440,
                 (int *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_9a0);
    }
    if ((local_97a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [107])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 0x12;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_978);
    if (local_178 != 0) goto LAB_00161354;
  }
  else {
LAB_00161354:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x161370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x1613d3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16142b);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_9d8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_9f8,"precision not allowed for this argument type",&local_9f9);
    std::allocator<char>::~allocator((allocator<char> *)&local_9f9);
    local_9fa = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_a24 = 0x2a;
      local_a28 = 2;
      fmt::v5::format<char[10],int,int>
                (in_stack_ffffffffffffe448,(int *)in_stack_ffffffffffffe440,
                 (int *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_a20);
    }
    if ((local_9fa & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [108])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 0x13;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_9f8);
    if (local_178 != 0) goto LAB_001617e4;
  }
  else {
LAB_001617e4:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x161800);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x161863);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1618bb);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a58);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a78,"precision not allowed for this argument type",&local_a79);
    std::allocator<char>::~allocator((allocator<char> *)&local_a79);
    local_a7a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_aa4 = 0x2a;
      local_aa8 = 2;
      fmt::v5::format<char[9],unsigned_int,int>
                ((char (*) [9])in_stack_ffffffffffffe448,(uint *)in_stack_ffffffffffffe440,
                 (int *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_aa0);
    }
    if ((local_a7a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [108])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 0x14;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_a78);
    if (local_178 != 0) goto LAB_00161c74;
  }
  else {
LAB_00161c74:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x161c90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x161cf3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x161d4b);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_ad8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_af8,"precision not allowed for this argument type",&local_af9);
    std::allocator<char>::~allocator((allocator<char> *)&local_af9);
    local_afa = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_b24 = 0x2a;
      local_b28 = 2;
      fmt::v5::format<char[10],unsigned_int,int>
                (in_stack_ffffffffffffe448,(uint *)in_stack_ffffffffffffe440,
                 (int *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_b20);
    }
    if ((local_afa & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [109])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 0x15;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_af8);
    if (local_178 != 0) goto LAB_00162104;
  }
  else {
LAB_00162104:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x162120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x162183);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1621db);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b58);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b78,"precision not allowed for this argument type",&local_b79);
    std::allocator<char>::~allocator((allocator<char> *)&local_b79);
    local_b7a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_ba8 = 0x2a;
      local_bac = 2;
      fmt::v5::format<char[9],long,int>
                ((char (*) [9])in_stack_ffffffffffffe448,(long *)in_stack_ffffffffffffe440,
                 (int *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_ba0);
    }
    if ((local_b7a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [108])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 0x16;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_b78);
    if (local_178 != 0) goto LAB_00162595;
  }
  else {
LAB_00162595:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x1625b1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x162614);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16266c);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_be0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c00,"precision not allowed for this argument type",&local_c01);
    std::allocator<char>::~allocator((allocator<char> *)&local_c01);
    local_c02 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_c30 = 0x2a;
      local_c34 = 2;
      fmt::v5::format<char[10],long,int>
                (in_stack_ffffffffffffe448,(long *)in_stack_ffffffffffffe440,
                 (int *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_c28);
    }
    if ((local_c02 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [109])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 0x17;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_c00);
    if (local_178 != 0) goto LAB_00162a26;
  }
  else {
LAB_00162a26:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x162a42);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x162aa5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x162afd);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c68);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c88,"precision not allowed for this argument type",&local_c89);
    std::allocator<char>::~allocator((allocator<char> *)&local_c89);
    local_c8a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_cb8 = 0x2a;
      local_cbc = 2;
      fmt::v5::format<char[9],unsigned_long,int>
                ((char (*) [9])in_stack_ffffffffffffe448,(unsigned_long *)in_stack_ffffffffffffe440,
                 (int *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_cb0);
    }
    if ((local_c8a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [109])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 0x18;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_c88);
    if (local_178 != 0) goto LAB_00162eb7;
  }
  else {
LAB_00162eb7:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x162ed3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x162f36);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x162f8e);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_cf0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_d10,"precision not allowed for this argument type",&local_d11);
    std::allocator<char>::~allocator((allocator<char> *)&local_d11);
    local_d12 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_d40 = 0x2a;
      local_d44 = 2;
      fmt::v5::format<char[10],unsigned_long,int>
                (in_stack_ffffffffffffe448,(unsigned_long *)in_stack_ffffffffffffe440,
                 (int *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_d38);
    }
    if ((local_d12 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [110])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 0x19;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_d10);
    if (local_178 != 0) goto LAB_00163348;
  }
  else {
LAB_00163348:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x163364);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x1633c7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16341f);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d78);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_d98,"precision not allowed for this argument type",&local_d99);
    std::allocator<char>::~allocator((allocator<char> *)&local_d99);
    local_d9a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_dc8 = 0x2a;
      local_dcc = 2;
      fmt::v5::format<char[9],long_long,int>
                ((char (*) [9])in_stack_ffffffffffffe448,(longlong *)in_stack_ffffffffffffe440,
                 (int *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_dc0);
    }
    if ((local_d9a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [109])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 0x1a;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_d98);
    if (local_178 != 0) goto LAB_001637d9;
  }
  else {
LAB_001637d9:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x1637f5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x163858);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1638b0);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e00);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_e20,"precision not allowed for this argument type",&local_e21);
    std::allocator<char>::~allocator((allocator<char> *)&local_e21);
    local_e22 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_e50 = 0x2a;
      local_e54 = 2;
      fmt::v5::format<char[10],long_long,int>
                (in_stack_ffffffffffffe448,(longlong *)in_stack_ffffffffffffe440,
                 (int *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_e48);
    }
    if ((local_e22 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [110])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 0x1b;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_e20);
    if (local_178 != 0) goto LAB_00163c6a;
  }
  else {
LAB_00163c6a:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x163c86);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x163ce9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x163d41);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e88);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_ea8,"precision not allowed for this argument type",&local_ea9);
    std::allocator<char>::~allocator((allocator<char> *)&local_ea9);
    local_eaa = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_ed8 = 0x2a;
      local_edc = 2;
      fmt::v5::format<char[9],unsigned_long_long,int>
                ((char (*) [9])in_stack_ffffffffffffe448,
                 (unsigned_long_long *)in_stack_ffffffffffffe440,
                 (int *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_ed0);
    }
    if ((local_eaa & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [110])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 0x1c;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_ea8);
    if (local_178 != 0) goto LAB_001640fb;
  }
  else {
LAB_001640fb:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x164117);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x16417a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1641d2);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f10);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_f30,"precision not allowed for this argument type",&local_f31);
    std::allocator<char>::~allocator((allocator<char> *)&local_f31);
    local_f32 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_f60 = 0x2a;
      local_f64 = 2;
      fmt::v5::format<char[10],unsigned_long_long,int>
                (in_stack_ffffffffffffe448,(unsigned_long_long *)in_stack_ffffffffffffe440,
                 (int *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_f58);
    }
    if ((local_f32 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [111])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 0x1d;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_f30);
    if (local_178 != 0) goto LAB_0016458c;
  }
  else {
LAB_0016458c:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x1645a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x16460b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x164663);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f98);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_fb8,"precision not allowed for this argument type",&local_fb9);
    std::allocator<char>::~allocator((allocator<char> *)&local_fb9);
    local_fba = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_fe1 = 0x78;
      local_fe8 = 0;
      fmt::v5::format<char[10],char,int>
                (in_stack_ffffffffffffe448,(char *)in_stack_ffffffffffffe440,
                 (int *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_fe0);
    }
    if ((local_fba & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [109])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 0x1e;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_fb8);
    if (local_178 != 0) goto LAB_00164a19;
  }
  else {
LAB_00164a19:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x164a35);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x164a98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x164af0);
  local_1040 = 0x3ff3c083126e978d;
  local_1044 = 2;
  fmt::v5::format<char[9],double,int>
            ((char (*) [9])in_stack_ffffffffffffe448,(double *)in_stack_ffffffffffffe440,
             (int *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            (in_stack_ffffffffffffe408,in_stack_ffffffffffffe400,
             (char (*) [4])CONCAT17(in_stack_ffffffffffffe3ff,in_stack_ffffffffffffe3f8),
             in_stack_ffffffffffffe3f0);
  std::__cxx11::string::~string(local_1038);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1018);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x164c07);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x164c6a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x164cc2);
  local_108c = 2;
  local_10a8 = _DAT_003380a0;
  fmt::v5::format<char[9],int,long_double>
            ((char (*) [9])in_stack_ffffffffffffe448,(int *)in_stack_ffffffffffffe440,
             (longdouble *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            (in_stack_ffffffffffffe408,in_stack_ffffffffffffe400,
             (char (*) [4])CONCAT17(in_stack_ffffffffffffe3ff,in_stack_ffffffffffffe3f8),
             in_stack_ffffffffffffe3f0);
  std::__cxx11::string::~string(local_1088);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1068);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x164dd4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x164e37);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x164e8f);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_10c8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_10e8,"precision not allowed for this argument type",&local_10e9);
    std::allocator<char>::~allocator((allocator<char> *)&local_10e9);
    local_10ea = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_1118 = 0xcafe;
      local_111c = 2;
      fmt::v5::format<char[9],void*,int>
                ((char (*) [9])in_stack_ffffffffffffe448,(void **)in_stack_ffffffffffffe440,
                 (int *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_1110);
    }
    if ((local_10ea & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [136])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 0x1f;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_10e8);
    if (local_178 != 0) goto LAB_00165243;
  }
  else {
LAB_00165243:
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    testing::AssertionResult::failure_message((AssertionResult *)0x16525f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
               in_stack_ffffffffffffe400);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
    testing::Message::~Message((Message *)0x1652bc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x165314);
  this_01 = local_1150;
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (bVar1) {
    in_stack_ffffffffffffe440 = &local_1171;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1170,"precision not allowed for this argument type",in_stack_ffffffffffffe440);
    std::allocator<char>::~allocator((allocator<char> *)&local_1171);
    local_1172 = 0;
    in_stack_ffffffffffffe43f = testing::internal::AlwaysTrue();
    if ((bool)in_stack_ffffffffffffe43f) {
      local_11a0 = 0xcafe;
      local_11a4 = 2;
      fmt::v5::format<char[10],void*,int>
                (&this_01->success_,(void **)in_stack_ffffffffffffe440,
                 (int *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
      std::__cxx11::string::~string(local_1198);
    }
    if ((local_1172 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffe420,
                 (char (*) [137])CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418));
      local_178 = 0x20;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_1170);
    if (local_178 == 0) goto LAB_00165756;
  }
  testing::Message::Message((Message *)in_stack_ffffffffffffe420);
  in_stack_ffffffffffffe408 = testing::AssertionResult::failure_message((AssertionResult *)0x1656ae)
  ;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
             in_stack_ffffffffffffe410,(int)((ulong)in_stack_ffffffffffffe408 >> 0x20),
             in_stack_ffffffffffffe400);
  testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe3f0);
  testing::Message::~Message((Message *)0x16570b);
LAB_00165756:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x165763);
  actual_expression = local_11f8;
  fmt::v5::format<char[9],char[4],int>
            (&this_01->success_,(char (*) [4])in_stack_ffffffffffffe440,
             (int *)CONCAT17(in_stack_ffffffffffffe43f,in_stack_ffffffffffffe438));
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_ffffffffffffe408,(char *)actual_expression,
             (char (*) [3])CONCAT17(in_stack_ffffffffffffe3ff,in_stack_ffffffffffffe3f8),
             in_stack_ffffffffffffe3f0);
  line = (int)((ulong)in_stack_ffffffffffffe408 >> 0x20);
  std::__cxx11::string::~string(local_11f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_11d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe420);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x16585b)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffe420,in_stack_ffffffffffffe41c,
               in_stack_ffffffffffffe410,line,(char *)actual_expression);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffe470,in_stack_ffffffffffffe468);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x1658b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16590d);
  return;
}

Assistant:

TEST(FormatterTest, RuntimePrecision) {
  char format_str[BUFFER_SIZE];
  safe_sprintf(format_str, "{0:.{%u", UINT_MAX);
  increment(format_str + 5);
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");
  std::size_t size = std::strlen(format_str);
  format_str[size] = '}';
  format_str[size + 1] = 0;
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");
  format_str[size + 1] = '}';
  format_str[size + 2] = 0;
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");

  EXPECT_THROW_MSG(format("{0:.{", 0),
      format_error, "invalid format string");
  EXPECT_THROW_MSG(format("{0:.{}", 0),
      format_error, "cannot switch from manual to automatic argument indexing");
  EXPECT_THROW_MSG(format("{0:.{?}}", 0),
      format_error, "invalid format string");
  EXPECT_THROW_MSG(format("{0:.{1}", 0, 0),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}}", 0),
      format_error, "argument index out of range");

  EXPECT_THROW_MSG(format("{0:.{0:}}", 0),
      format_error, "invalid format string");

  EXPECT_THROW_MSG(format("{0:.{1}}", 0, -1),
      format_error, "negative precision");
  EXPECT_THROW_MSG(format("{0:.{1}}", 0, (INT_MAX + 1u)),
      format_error, "number is too big");
  EXPECT_THROW_MSG(format("{0:.{1}}", 0, -1l),
      format_error, "negative precision");
  if (fmt::internal::const_check(sizeof(long) > sizeof(int))) {
    long value = INT_MAX;
    EXPECT_THROW_MSG(format("{0:.{1}}", 0, (value + 1)),
        format_error, "number is too big");
  }
  EXPECT_THROW_MSG(format("{0:.{1}}", 0, (INT_MAX + 1ul)),
      format_error, "number is too big");

  EXPECT_THROW_MSG(format("{0:.{1}}", 0, '0'),
      format_error, "precision is not integer");
  EXPECT_THROW_MSG(format("{0:.{1}}", 0, 0.0),
      format_error, "precision is not integer");

  EXPECT_THROW_MSG(format("{0:.{1}}", 42, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}f}", 42, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}}", 42u, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}f}", 42u, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}}", 42l, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}f}", 42l, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}}", 42ul, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}f}", 42ul, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}}", 42ll, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}f}", 42ll, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}}", 42ull, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}f}", 42ull, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:3.{1}}", 'x', 0),
      format_error, "precision not allowed for this argument type");
  EXPECT_EQ("1.2", format("{0:.{1}}", 1.2345, 2));
  EXPECT_EQ("1.2", format("{1:.{0}}", 2, 1.2345l));

  EXPECT_THROW_MSG(format("{0:.{1}}", reinterpret_cast<void*>(0xcafe), 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}f}", reinterpret_cast<void*>(0xcafe), 2),
      format_error, "precision not allowed for this argument type");

  EXPECT_EQ("st", format("{0:.{1}}", "str", 2));
}